

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

ostream * dump_generic_port(ostream *o,string *name,string *doc,string *type)

{
  char *pcVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  string *in_RCX;
  string *type_00;
  string *in_RDX;
  string *in_RSI;
  ostream *in_RDI;
  bool bVar5;
  uint i;
  string args;
  string arg_names;
  char *t;
  ostream *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [36];
  uint local_8c;
  string local_88 [32];
  undefined4 local_68;
  allocator<char> local_51;
  string local_50 [32];
  string *psVar6;
  string *name_00;
  string *o_00;
  ostream *local_8;
  
  name_00 = in_RDX;
  o_00 = in_RSI;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (allocator<char> *)in_stack_fffffffffffffe90);
  std::allocator<char>::~allocator(&local_51);
  type_00 = (string *)(pcVar1 + 1);
  local_8 = in_RDI;
  if (*pcVar1 == ':') {
    std::__cxx11::string::string(local_88);
    while( true ) {
      bVar5 = false;
      if (type_00->_M_dataplus != (_Alloc_hider)0x0) {
        bVar5 = type_00->_M_dataplus != (_Alloc_hider)0x3a;
      }
      if (!bVar5) break;
      psVar6 = (string *)&type_00->field_0x1;
      std::__cxx11::string::operator+=(local_88,(char)type_00->_M_dataplus);
      type_00 = psVar6;
    }
    poVar2 = std::operator<<(in_RDI," <message_in pattern=\"");
    poVar2 = std::operator<<(poVar2,in_RSI);
    poVar2 = std::operator<<(poVar2,"\" typetag=\"");
    poVar2 = std::operator<<(poVar2,local_88);
    std::operator<<(poVar2,"\">\n");
    poVar2 = std::operator<<(in_RDI,"  <desc>");
    poVar2 = std::operator<<(poVar2,(string *)in_RDX);
    std::operator<<(poVar2,"</desc>\n");
    for (local_8c = 0; uVar3 = (ulong)local_8c, uVar4 = std::__cxx11::string::length(),
        uVar3 < uVar4; local_8c = local_8c + 1) {
      in_stack_fffffffffffffea0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(in_RDI,"  <param_");
      in_stack_fffffffffffffe98 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
      in_stack_fffffffffffffe90 =
           std::operator<<((ostream *)in_stack_fffffffffffffea0,*in_stack_fffffffffffffe98);
      poVar2 = std::operator<<(in_stack_fffffffffffffe90," symbol=\"");
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
      poVar2 = std::operator<<(poVar2,*pcVar1);
      std::operator<<(poVar2,"\"/>\n");
    }
    std::operator<<(in_RDI," </message_in>\n");
    if (type_00->_M_dataplus == (_Alloc_hider)0x3a) {
      std::__cxx11::string::string(local_b0,in_RSI);
      std::__cxx11::string::string(local_d0,(string *)in_RDX);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (allocator<char> *)in_stack_fffffffffffffe90);
      local_8 = dump_generic_port((ostream *)o_00,name_00,in_RCX,type_00);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_b0);
    }
    local_68 = 1;
    std::__cxx11::string::~string(local_88);
  }
  else {
    local_68 = 1;
  }
  std::__cxx11::string::~string(local_50);
  return local_8;
}

Assistant:

static ostream &dump_generic_port(ostream &o, string name, string doc, string type)
{
    const char *t = type.c_str();
    string arg_names = "xyzabcdefghijklmnopqrstuvw";

    //start out with argument separator
    if(*t++ != ':')
        return o;
    //now real arguments (assume [] don't exist)
    string args;
    while(*t && *t != ':')
        args += *t++;

    o << " <message_in pattern=\"" << name << "\" typetag=\"" << args << "\">\n";
    o << "  <desc>" << doc << "</desc>\n";

    assert(args.length()<arg_names.length());
    for(unsigned i=0; i<args.length(); ++i)
        o << "  <param_" << args[i] << " symbol=\"" << arg_names[i] << "\"/>\n";
    o << " </message_in>\n";

    if(*t == ':')
        return dump_generic_port(o, name, doc, t);
    else
        return o;
}